

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void set_early_term_based_on_uv_plane
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,MACROBLOCKD *xd,int mi_row,int mi_col,
               int *early_term,int num_blk,uint *sse_tx,uint *var_tx,int sum,uint var,uint sse)

{
  BLOCK_SIZE BVar1;
  short *psVar2;
  uint uVar3;
  sbyte sVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  buf_2d *pbVar15;
  int j;
  long lVar16;
  bool bVar17;
  int skip_uv [2];
  uint sse_uv [2];
  
  psVar2 = x->plane[0].dequant_QTX;
  iVar8 = (int)*psVar2;
  iVar10 = (int)psVar2[1];
  uVar12 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  uVar3 = -sum;
  if (0 < sum) {
    uVar3 = sum;
  }
  uVar5 = (ulong)(byte)(((cpi->common).height < 0x1e1 && (cpi->common).width < 0x281) + 1);
  if (4 < uVar3 >> (""[uVar12] + ""[uVar12] & 0x1f)) {
    uVar5 = 0;
  }
  sVar4 = (sbyte)uVar5;
  if ((cpi->oxcf).speed < 8) {
    sVar4 = 0;
  }
  uVar11 = (ulong)(((uint)(iVar10 * iVar10) >> 6) << sVar4);
  bVar17 = (cpi->sf).rt_sf.increase_source_sad_thresh != 0;
  uVar5 = uVar11 * 4;
  if (!bVar17) {
    uVar5 = uVar11;
  }
  if (num_blk < 1) {
    num_blk = 0;
  }
  uVar11 = 0;
  while (uVar13 = uVar11, (uint)num_blk != uVar13) {
    if (((var != 0) && (uVar5 <= var_tx[uVar13])) ||
       ((uVar11 = uVar13 + 1, sse != var &&
        (((uint)(iVar8 * iVar8) >> 6) << bVar17 <= sse_tx[uVar13] - var_tx[uVar13])))) {
      return;
    }
  }
  skip_uv[0] = 0;
  skip_uv[1] = 0;
  piVar14 = &xd->plane[1].subsampling_x;
  pbVar15 = &x->plane[1].src;
  lVar9 = 0;
  for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
    skip_uv[lVar16] = 1;
    if (x->color_sensitivity[lVar16] != '\0') {
      skip_uv[lVar16] = 0;
      BVar1 = av1_ss_size_lookup[uVar12][*piVar14][piVar14[1]];
      iVar8 = (cpi->sf).rt_sf.increase_source_sad_thresh;
      iVar7 = (int)**(int16_t **)((long)(pbVar15 + 2) + 0x10);
      iVar6 = (int)(*(int16_t **)((long)(pbVar15 + 2) + 0x10))[1];
      iVar10 = (int)lVar16 + 1;
      av1_enc_build_inter_predictor
                (&cpi->common,xd,mi_row,mi_col,(BUFFER_SET *)0x0,bsize,iVar10,iVar10);
      uVar3 = (*cpi->ppi->fn_ptr[BVar1].vf)
                        (pbVar15->buf,pbVar15->stride,((buf_2d *)(piVar14 + 3))->buf,piVar14[9],
                         (uint *)((long)sse_uv + lVar9));
      if ((uint)(iVar6 * iVar6) >> (iVar8 != 0) * '\x02' + 3 <= uVar3 && uVar3 != 0) break;
      if ((sse_uv[lVar16] != uVar3) &&
         ((uint)(iVar7 * iVar7) >> (4U - (iVar8 == 0) & 0x1f) <= sse_uv[lVar16] - uVar3)) break;
      skip_uv[lVar16] = 1;
    }
    lVar9 = lVar9 + 4;
    piVar14 = piVar14 + 0x28c;
    pbVar15 = (buf_2d *)((long)(pbVar15 + 4) + 8);
  }
  if ((skip_uv[0] & skip_uv[1]) == 0) {
    return;
  }
  *early_term = 1;
  return;
}

Assistant:

static inline void set_early_term_based_on_uv_plane(
    AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, MACROBLOCKD *xd, int mi_row,
    int mi_col, int *early_term, int num_blk, const unsigned int *sse_tx,
    const unsigned int *var_tx, int sum, unsigned int var, unsigned int sse) {
  AV1_COMMON *const cm = &cpi->common;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  const uint32_t dc_quant = p->dequant_QTX[0];
  const uint32_t ac_quant = p->dequant_QTX[1];
  int64_t dc_thr = dc_quant * dc_quant >> 6;
  int64_t ac_thr = ac_quant * ac_quant >> 6;
  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  int ac_test = 1;
  int dc_test = 1;
  const int norm_sum = abs(sum) >> (bw + bh);

#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && denoise_svc(cpi) &&
      cpi->oxcf.speed > 5)
    ac_thr = av1_scale_acskip_thresh(ac_thr, cpi->denoiser.denoising_level,
                                     norm_sum, cpi->svc.temporal_layer_id);
  else
    ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);
#else
  ac_thr *= ac_thr_factor(cpi->oxcf.speed, cm->width, cm->height, norm_sum);

#endif

  if (cpi->sf.rt_sf.increase_source_sad_thresh) {
    dc_thr = dc_thr << 1;
    ac_thr = ac_thr << 2;
  }

  for (int k = 0; k < num_blk; k++) {
    // Check if all ac coefficients can be quantized to zero.
    if (!(var_tx[k] < ac_thr || var == 0)) {
      ac_test = 0;
      break;
    }
    // Check if dc coefficient can be quantized to zero.
    if (!(sse_tx[k] - var_tx[k] < dc_thr || sse == var)) {
      dc_test = 0;
      break;
    }
  }

  // Check if chroma can be skipped based on ac and dc test flags.
  if (ac_test && dc_test) {
    int skip_uv[2] = { 0 };
    unsigned int var_uv[2];
    unsigned int sse_uv[2];
    // Transform skipping test in UV planes.
    for (int plane = AOM_PLANE_U; plane <= AOM_PLANE_V; plane++) {
      int j = plane - 1;
      skip_uv[j] = 1;
      if (x->color_sensitivity[COLOR_SENS_IDX(plane)]) {
        skip_uv[j] = 0;
        struct macroblock_plane *const puv = &x->plane[plane];
        struct macroblockd_plane *const puvd = &xd->plane[plane];
        const BLOCK_SIZE uv_bsize = get_plane_block_size(
            bsize, puvd->subsampling_x, puvd->subsampling_y);
        // Adjust these thresholds for UV.
        const int shift_ac = cpi->sf.rt_sf.increase_source_sad_thresh ? 5 : 3;
        const int shift_dc = cpi->sf.rt_sf.increase_source_sad_thresh ? 4 : 3;
        const int64_t uv_dc_thr =
            (puv->dequant_QTX[0] * puv->dequant_QTX[0]) >> shift_dc;
        const int64_t uv_ac_thr =
            (puv->dequant_QTX[1] * puv->dequant_QTX[1]) >> shift_ac;
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                      plane, plane);
        var_uv[j] = cpi->ppi->fn_ptr[uv_bsize].vf(puv->src.buf, puv->src.stride,
                                                  puvd->dst.buf,
                                                  puvd->dst.stride, &sse_uv[j]);
        if ((var_uv[j] < uv_ac_thr || var_uv[j] == 0) &&
            (sse_uv[j] - var_uv[j] < uv_dc_thr || sse_uv[j] == var_uv[j]))
          skip_uv[j] = 1;
        else
          break;
      }
    }
    if (skip_uv[0] & skip_uv[1]) {
      *early_term = 1;
    }
  }
}